

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O2

void __thiscall xLearn::Checker::check_conflict_train(Checker *this,HyperParam *hyper_param)

{
  string *psVar1;
  byte bVar2;
  int iVar3;
  allocator local_39;
  string local_38;
  
  if ((hyper_param->from_file == false) && (hyper_param->cross_validation == true)) {
    std::__cxx11::string::string
              ((string *)&local_38,
               "Transform DMatrix not from file doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,&local_39);
    Color::print_warning(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    hyper_param->cross_validation = false;
  }
  bVar2 = hyper_param->cross_validation;
  if ((hyper_param->on_disk == true) && ((bVar2 & 1) != 0)) {
    std::__cxx11::string::string
              ((string *)&local_38,
               "On-disk training doesn\'t support cross-validation. xLearn has already disable the -cv option."
               ,&local_39);
    Color::print_warning(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    hyper_param->cross_validation = false;
  }
  else {
    if (((bVar2 & 1) != 0) && (hyper_param->early_stop == true)) {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "Cross-validation doesn\'t support early-stopping. xLearn has already close early-stopping."
                 ,&local_39);
      Color::print_warning(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      hyper_param->early_stop = false;
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && ((hyper_param->test_set_file)._M_string_length != 0)) {
      StringPrintf_abi_cxx11_
                (&local_38,
                 "The --cv (cross-validation) has been set, and xLearn will ignore the validation file: %s"
                 ,(hyper_param->test_set_file)._M_dataplus._M_p);
      Color::print_warning(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      (hyper_param->validate_set_file)._M_string_length = 0;
      *(hyper_param->validate_set_file)._M_dataplus._M_p = '\0';
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && (hyper_param->quiet == true)) {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "The --cv (cross-validation) has been set, and xLearn will ignore the --quiet option."
                 ,&local_39);
      Color::print_warning(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      hyper_param->quiet = false;
      bVar2 = hyper_param->cross_validation;
    }
    if (((bVar2 & 1) != 0) && ((hyper_param->model_file)._M_string_length != 0)) {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "The --cv (cross-validation) has been set, and xLearn will not dump model checkpoint to disk."
                 ,&local_39);
      Color::print_warning(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      (hyper_param->model_file)._M_string_length = 0;
      *(hyper_param->model_file)._M_dataplus._M_p = '\0';
    }
  }
  if ((((hyper_param->validate_set_file)._M_string_length == 0) &&
      (hyper_param->valid_dataset == (DMatrix *)0x0)) && (hyper_param->early_stop == true)) {
    std::__cxx11::string::string
              ((string *)&local_38,
               "Validation file(dataset) not found, xLearn has already disable early-stopping.",
               &local_39);
    Color::print_warning(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    hyper_param->early_stop = false;
  }
  psVar1 = &hyper_param->metric;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (((iVar3 != 0) && ((hyper_param->validate_set_file)._M_string_length == 0)) &&
     ((hyper_param->valid_dataset == (DMatrix *)0x0 && (hyper_param->cross_validation == false)))) {
    StringPrintf_abi_cxx11_
              (&local_38,"Validation file not found, xLearn has already disable (-x %s) option.",
               (psVar1->_M_dataplus)._M_p);
    Color::print_warning(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::assign((char *)psVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
  if (iVar3 == 0) {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
       ((iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0 &&
        (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)))) {
      return;
    }
    StringPrintf_abi_cxx11_
              (&local_38,
               "The -x: %s metric can only be used in classification tasks. xLearn will ignore this option."
               ,(psVar1->_M_dataplus)._M_p);
    Color::print_warning(&local_38);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
    if (iVar3 != 0) {
      return;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
        (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
       (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) {
      return;
    }
    StringPrintf_abi_cxx11_
              (&local_38,
               "The -x: %s metric can only be used in regression tasks. xLearn will ignore this option."
               ,(psVar1->_M_dataplus)._M_p);
    Color::print_warning(&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::assign((char *)psVar1);
  return;
}

Assistant:

void Checker::check_conflict_train(HyperParam& hyper_param) {
  if (!hyper_param.from_file && hyper_param.cross_validation) {
    Color::print_warning("Transform DMatrix not from file doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.on_disk && hyper_param.cross_validation) {
    Color::print_warning("On-disk training doesn't support cross-validation. "
                         "xLearn has already disable the -cv option.");
    hyper_param.cross_validation = false;
  }
  if (hyper_param.cross_validation && hyper_param.early_stop) {
    Color::print_warning("Cross-validation doesn't support early-stopping. "
                         "xLearn has already close early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.cross_validation && !hyper_param.test_set_file.empty()) {
    Color::print_warning(
      StringPrintf("The --cv (cross-validation) has been set, and "
                   "xLearn will ignore the validation file: %s",
                   hyper_param.test_set_file.c_str())
    );
    hyper_param.validate_set_file.clear();
  }
  if (hyper_param.cross_validation && hyper_param.quiet) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will ignore the --quiet option.");
    hyper_param.quiet = false;
  }
  if (hyper_param.cross_validation && !hyper_param.model_file.empty()) {
    Color::print_warning("The --cv (cross-validation) has been set, and "
                         "xLearn will not dump model checkpoint to disk.");
    hyper_param.model_file.clear();
  }
  if ((hyper_param.validate_set_file.empty() && hyper_param.valid_dataset == nullptr) 
      && hyper_param.early_stop) {
    Color::print_warning("Validation file(dataset) not found, xLearn has already "
                         "disable early-stopping.");
    hyper_param.early_stop = false;
  }
  if (hyper_param.metric.compare("none") != 0 &&
      hyper_param.validate_set_file.empty() && 
      hyper_param.valid_dataset == nullptr &&
      !hyper_param.cross_validation) {
    Color::print_warning(
      StringPrintf("Validation file not found, xLearn has already "
                   "disable (-x %s) option.", 
                   hyper_param.metric.c_str())
    );
    hyper_param.metric = "none";
  }
  if (hyper_param.loss_func.compare("squared") == 0) {
    if (hyper_param.metric.compare("acc") == 0 ||
        hyper_param.metric.compare("prec") == 0 ||
        hyper_param.metric.compare("recall") == 0 ||
        hyper_param.metric.compare("f1") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in classification tasks. xLearn will "
                     "ignore this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  } else if (hyper_param.loss_func.compare("cross-entropy") == 0) {
    if (hyper_param.metric.compare("mae") == 0 ||
        hyper_param.metric.compare("mape") == 0 ||
        hyper_param.metric.compare("rmsd") == 0 ||
        hyper_param.metric.compare("rmse") == 0) {
      Color::print_warning(
        StringPrintf("The -x: %s metric can only be used "
                     "in regression tasks. xLearn will ignore "
                     "this option.",
                     hyper_param.metric.c_str())
      );
      hyper_param.metric = "none";
    }
  }
}